

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.cc
# Opt level: O1

CordRep * absl::lts_20250127::cord_internal::anon_unknown_10::Substring
                    (CordRep *rep,size_t offset,size_t n)

{
  byte bVar1;
  ulong uVar2;
  CordRep *pCVar3;
  
  uVar2 = rep->length;
  if (uVar2 < n) {
    __assert_fail("n <= rep->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                  ,0x28,
                  "CordRep *absl::cord_internal::(anonymous namespace)::Substring(CordRep *, size_t, size_t)"
                 );
  }
  if (offset < uVar2) {
    if (uVar2 - n < offset) {
      __assert_fail("offset <= rep->length - n",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                    ,0x2a,
                    "CordRep *absl::cord_internal::(anonymous namespace)::Substring(CordRep *, size_t, size_t)"
                   );
    }
    bVar1 = rep->tag;
    if (bVar1 < 5) {
      pCVar3 = rep;
      if (bVar1 == 1) {
        pCVar3 = *(CordRep **)&rep[1].refcount;
      }
      if (pCVar3->tag < 5) {
        __assert_fail("IsDataEdge(rep)",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                      ,0x2b,
                      "CordRep *absl::cord_internal::(anonymous namespace)::Substring(CordRep *, size_t, size_t)"
                     );
      }
    }
    if (n == 0) {
      rep = (CordRep *)0x0;
    }
    else if (uVar2 == n) {
      LOCK();
      (rep->refcount).count_.super___atomic_base<int>._M_i =
           (rep->refcount).count_.super___atomic_base<int>._M_i + 2;
      UNLOCK();
    }
    else {
      pCVar3 = rep;
      if (bVar1 == 1) {
        offset = offset + rep[1].length;
        pCVar3 = *(CordRep **)&rep[1].refcount;
      }
      if (pCVar3->tag < 5) {
        __assert_fail("rep->IsExternal() || rep->IsFlat()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                      ,0x35,
                      "CordRep *absl::cord_internal::(anonymous namespace)::Substring(CordRep *, size_t, size_t)"
                     );
      }
      rep = (CordRep *)operator_new(0x20);
      rep->length = 0;
      rep->refcount = (atomic<int>)0x0;
      rep->tag = '\0';
      rep->storage[0] = '\0';
      rep->storage[1] = '\0';
      rep->storage[2] = '\0';
      rep[1].length = 0;
      rep[1].refcount = (atomic<int>)0x0;
      rep[1].tag = '\0';
      rep[1].storage[0] = '\0';
      rep[1].storage[1] = '\0';
      rep[1].storage[2] = '\0';
      (rep->refcount).count_.super___atomic_base<int>._M_i = 2;
      rep->length = n;
      rep->tag = '\x01';
      rep[1].length = offset;
      if (pCVar3 == (CordRep *)0x0) {
        __assert_fail("rep != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
      }
      LOCK();
      (pCVar3->refcount).count_.super___atomic_base<int>._M_i =
           (pCVar3->refcount).count_.super___atomic_base<int>._M_i + 2;
      UNLOCK();
      *(CordRep **)&rep[1].refcount = pCVar3;
    }
    return rep;
  }
  __assert_fail("offset < rep->length",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                ,0x29,
                "CordRep *absl::cord_internal::(anonymous namespace)::Substring(CordRep *, size_t, size_t)"
               );
}

Assistant:

inline CordRep* Substring(CordRep* rep, size_t offset, size_t n) {
  assert(n <= rep->length);
  assert(offset < rep->length);
  assert(offset <= rep->length - n);
  assert(IsDataEdge(rep));

  if (n == 0) return nullptr;
  if (n == rep->length) return CordRep::Ref(rep);

  if (rep->tag == SUBSTRING) {
    offset += rep->substring()->start;
    rep = rep->substring()->child;
  }

  assert(rep->IsExternal() || rep->IsFlat());
  CordRepSubstring* substring = new CordRepSubstring();
  substring->length = n;
  substring->tag = SUBSTRING;
  substring->start = offset;
  substring->child = CordRep::Ref(rep);
  return substring;
}